

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayhelper.cpp
# Opt level: O1

double * ArrayHelper::getArray(size_t rows,size_t cols,bool zero)

{
  double *pdVar1;
  double *__s;
  
  pdVar1 = (double *)operator_new__(-(ulong)(cols * rows >> 0x3d != 0) | cols * rows * 8);
  if (rows != 0 && zero) {
    __s = pdVar1;
    do {
      if (cols != 0) {
        memset(__s,0,cols * 8);
      }
      __s = __s + cols;
      rows = rows - 1;
    } while (rows != 0);
  }
  return pdVar1;
}

Assistant:

double* ArrayHelper::getArray(size_t rows, size_t cols, bool zero) {
	double* array = new double[rows*cols];
	if (zero) {
		for (size_t i = 0; i < rows; i++) {
			for (size_t j = 0; j < cols; j++) {
				array[i * cols + j] = 0;
			}
		}
	} 
	return array;
}